

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::char_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
           *this,align_spec *spec,char_writer *f)

{
  uint uVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  wchar_t __tmp;
  ulong uVar8;
  size_t size;
  char_type *pcVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  basic_buffer<wchar_t> *c;
  int iVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  uVar1 = spec->width_;
  uVar8 = (ulong)uVar1;
  puVar3 = *(undefined8 **)this;
  lVar11 = puVar3[2];
  if (uVar8 < 2) {
    uVar8 = lVar11 + 1;
    if ((ulong)puVar3[3] < uVar8) {
      (**(code **)*puVar3)(puVar3,uVar8);
    }
    puVar3[2] = uVar8;
    pcVar9 = (char_type *)(lVar11 * 4 + puVar3[1]);
  }
  else {
    uVar13 = lVar11 + uVar8;
    if ((ulong)puVar3[3] < uVar13) {
      (**(code **)*puVar3)(puVar3,uVar13);
    }
    puVar3[2] = uVar13;
    auVar7 = _DAT_0023b030;
    auVar6 = _DAT_0023b020;
    auVar5 = _DAT_0023b010;
    lVar4 = puVar3[1];
    pcVar9 = (char_type *)(lVar4 + lVar11 * 4);
    wVar2 = spec->fill_;
    uVar13 = uVar8 - 1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar10 = uVar13 >> 1;
      if (uVar1 != 2) {
        pcVar9 = pcVar9 + uVar10;
        uVar12 = uVar10 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar22._8_4_ = (int)uVar12;
        auVar22._0_8_ = uVar12;
        auVar22._12_4_ = (int)(uVar12 >> 0x20);
        lVar4 = lVar4 + lVar11 * 4;
        lVar11 = 0;
        auVar22 = auVar22 ^ _DAT_0023b030;
        do {
          auVar19._8_4_ = (int)lVar11;
          auVar19._0_8_ = lVar11;
          auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar23 = (auVar19 | auVar6) ^ auVar7;
          iVar17 = auVar22._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar17 && auVar22._0_4_ < auVar23._0_4_ ||
                      iVar17 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar4 + lVar11 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
              auVar23._12_4_ <= auVar22._12_4_) {
            *(wchar_t *)(lVar4 + 4 + lVar11 * 4) = wVar2;
          }
          auVar19 = (auVar19 | auVar5) ^ auVar7;
          iVar24 = auVar19._4_4_;
          if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar19._0_4_ <= auVar22._0_4_)) {
            *(wchar_t *)(lVar4 + 8 + lVar11 * 4) = wVar2;
            *(wchar_t *)(lVar4 + 0xc + lVar11 * 4) = wVar2;
          }
          lVar11 = lVar11 + 4;
        } while ((uVar12 - ((uint)(uVar10 + 0x3fffffffffffffff) & 3)) + 4 != lVar11);
      }
      *pcVar9 = f->value;
      auVar7 = _DAT_0023b030;
      auVar6 = _DAT_0023b020;
      auVar5 = _DAT_0023b010;
      if (uVar13 == 0) {
        return;
      }
      uVar13 = (uVar8 * 4 + uVar10 * -4) - 8;
      auVar23._8_4_ = (int)uVar13;
      auVar23._0_8_ = uVar13;
      auVar23._12_4_ = (int)(uVar13 >> 0x20);
      auVar15._0_8_ = uVar13 >> 2;
      auVar15._8_8_ = auVar23._8_8_ >> 2;
      uVar8 = 0;
      auVar15 = auVar15 ^ _DAT_0023b030;
      do {
        auVar20._8_4_ = (int)uVar8;
        auVar20._0_8_ = uVar8;
        auVar20._12_4_ = (int)(uVar8 >> 0x20);
        auVar22 = (auVar20 | auVar6) ^ auVar7;
        iVar17 = auVar15._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar17 && auVar15._0_4_ < auVar22._0_4_ ||
                    iVar17 < auVar22._4_4_) & 1)) {
          pcVar9[uVar8 + 1] = wVar2;
        }
        if ((auVar22._12_4_ != auVar15._12_4_ || auVar22._8_4_ <= auVar15._8_4_) &&
            auVar22._12_4_ <= auVar15._12_4_) {
          pcVar9[uVar8 + 2] = wVar2;
        }
        auVar22 = (auVar20 | auVar5) ^ auVar7;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar15._0_4_)) {
          pcVar9[uVar8 + 3] = wVar2;
          pcVar9[uVar8 + 4] = wVar2;
        }
        uVar8 = uVar8 + 4;
      } while (((uVar13 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
      return;
    }
    if (spec->align_ != ALIGN_RIGHT) {
      *pcVar9 = f->value;
      auVar7 = _DAT_0023b030;
      auVar6 = _DAT_0023b020;
      auVar5 = _DAT_0023b010;
      if (uVar13 == 0) {
        return;
      }
      uVar13 = uVar8 + 0x3ffffffffffffffe & 0x3fffffffffffffff;
      auVar16._8_4_ = (int)uVar13;
      auVar16._0_8_ = uVar13;
      auVar16._12_4_ = (int)(uVar13 >> 0x20);
      lVar4 = lVar4 + lVar11 * 4;
      lVar11 = 0;
      auVar16 = auVar16 ^ _DAT_0023b030;
      do {
        auVar21._8_4_ = (int)lVar11;
        auVar21._0_8_ = lVar11;
        auVar21._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar22 = (auVar21 | auVar6) ^ auVar7;
        iVar17 = auVar16._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar17 && auVar16._0_4_ < auVar22._0_4_ ||
                    iVar17 < auVar22._4_4_) & 1)) {
          *(wchar_t *)(lVar4 + 4 + lVar11 * 4) = wVar2;
        }
        if ((auVar22._12_4_ != auVar16._12_4_ || auVar22._8_4_ <= auVar16._8_4_) &&
            auVar22._12_4_ <= auVar16._12_4_) {
          *(wchar_t *)(lVar4 + 8 + lVar11 * 4) = wVar2;
        }
        auVar22 = (auVar21 | auVar5) ^ auVar7;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar16._0_4_)) {
          *(wchar_t *)(lVar4 + 0xc + lVar11 * 4) = wVar2;
          *(wchar_t *)(lVar4 + 0x10 + lVar11 * 4) = wVar2;
        }
        lVar11 = lVar11 + 4;
      } while ((uVar13 - ((uint)(uVar8 + 0x3ffffffffffffffe) & 3)) + 4 != lVar11);
      return;
    }
    if (uVar13 != 0) {
      pcVar9 = pcVar9 + uVar13;
      uVar13 = uVar8 + 0x3ffffffffffffffe & 0x3fffffffffffffff;
      auVar14._8_4_ = (int)uVar13;
      auVar14._0_8_ = uVar13;
      auVar14._12_4_ = (int)(uVar13 >> 0x20);
      lVar4 = lVar4 + lVar11 * 4;
      lVar11 = 0;
      auVar14 = auVar14 ^ _DAT_0023b030;
      do {
        auVar18._8_4_ = (int)lVar11;
        auVar18._0_8_ = lVar11;
        auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar22 = (auVar18 | auVar6) ^ auVar7;
        iVar17 = auVar14._4_4_;
        if ((bool)(~(auVar22._4_4_ == iVar17 && auVar14._0_4_ < auVar22._0_4_ ||
                    iVar17 < auVar22._4_4_) & 1)) {
          *(wchar_t *)(lVar4 + lVar11 * 4) = wVar2;
        }
        if ((auVar22._12_4_ != auVar14._12_4_ || auVar22._8_4_ <= auVar14._8_4_) &&
            auVar22._12_4_ <= auVar14._12_4_) {
          *(wchar_t *)(lVar4 + 4 + lVar11 * 4) = wVar2;
        }
        auVar22 = (auVar18 | auVar5) ^ auVar7;
        iVar24 = auVar22._4_4_;
        if (iVar24 <= iVar17 && (iVar24 != iVar17 || auVar22._0_4_ <= auVar14._0_4_)) {
          *(wchar_t *)(lVar4 + 8 + lVar11 * 4) = wVar2;
          *(wchar_t *)(lVar4 + 0xc + lVar11 * 4) = wVar2;
        }
        lVar11 = lVar11 + 4;
      } while ((uVar13 - ((uint)(uVar8 + 0x3ffffffffffffffe) & 3)) + 4 != lVar11);
    }
  }
  *pcVar9 = f->value;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }